

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
ValidatorTest_ReturnUnreachable_Test::TestBody(ValidatorTest_ReturnUnreachable_Test *this)

{
  __node_base_ptr *this_00;
  char cVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  pointer *__ptr;
  Expression *body;
  undefined1 auVar4 [16];
  Name name;
  undefined1 local_480 [8];
  Module module;
  undefined1 local_88 [40];
  AssertHelper local_60;
  undefined1 auStack_58 [8];
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  Module *local_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  
  ::wasm::Module::Module((Module *)local_480);
  auVar4 = ::wasm::IString::interned(4,"func",0);
  local_88._0_8_ = (char *)0x0;
  local_88._8_8_ = (char *)0x0;
  local_88._16_8_ = 0;
  ::wasm::HeapType::HeapType
            ((HeapType *)&module.tagsMap._M_h._M_single_bucket,(Signature)ZEXT816(0));
  this_00 = &module.typeIndices._M_h._M_single_bucket;
  auStack_58 = (undefined1  [8])0x0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  puVar2 = (undefined1 *)MixedArena::allocSpace((MixedArena *)this_00,0x10,8);
  *puVar2 = 0x17;
  *(undefined8 *)(puVar2 + 8) = 1;
  puVar3 = (undefined1 *)MixedArena::allocSpace((MixedArena *)this_00,0x18,8);
  *puVar3 = 0x13;
  *(undefined8 *)(puVar3 + 8) = 0;
  *(undefined8 *)(puVar3 + 0x10) = 0;
  *(undefined8 *)(puVar3 + 8) = 1;
  *(undefined1 **)(puVar3 + 0x10) = puVar2;
  body = (Expression *)auStack_58;
  name.super_IString.str._M_str = auVar4._0_8_;
  name.super_IString.str._M_len = (size_t)&local_30;
  ::wasm::Builder::makeFunction
            (name,auVar4._8_8_,(HeapType)local_88,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
             module.tagsMap._M_h._M_single_bucket,body);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - (long)auStack_58);
  }
  if ((char *)local_88._0_8_ != (char *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  cVar1 = ::wasm::WasmValidator::validate((Function *)local_88,local_30,(uint)local_480);
  auStack_58 = (undefined1  [8])(CONCAT71(auStack_58._1_7_,cVar1) ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)auStack_58,
               (AssertionResult *)"WasmValidator{}.validate(func.get(), module, flags)","true",
               "false",(char *)body);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x42,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(uintptr_t *)local_38._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  if (local_30 != (Module *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_30,(Function *)local_30);
  }
  ::wasm::Module::~Module((Module *)local_480);
  return;
}

Assistant:

TEST(ValidatorTest, ReturnUnreachable) {
  Module module;
  Builder builder(module);

  // (return (unreachable)) should be invalid if a function has no return type.
  auto func =
    builder.makeFunction("func",
                         {},
                         Signature(Type::none, Type::none),
                         {},
                         builder.makeReturn(builder.makeUnreachable()));

  auto flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(WasmValidator{}.validate(func.get(), module, flags));
}